

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

char * Dau_ParseFormulaEndToken(char *pForm)

{
  char *local_20;
  char *pThis;
  int Counter;
  char *pForm_local;
  
  pThis._4_4_ = 0;
  local_20 = pForm;
  do {
    if (*local_20 == '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                    ,0x5d,"char *Dau_ParseFormulaEndToken(char *)");
    }
    if (*local_20 != '~') {
      if (*local_20 == '(') {
        pThis._4_4_ = pThis._4_4_ + 1;
      }
      else if (*local_20 == ')') {
        pThis._4_4_ = pThis._4_4_ + -1;
      }
      if (pThis._4_4_ == 0) {
        return local_20 + 1;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

char * Dau_ParseFormulaEndToken( char * pForm )
{
    int Counter = 0;
    char * pThis;
    for ( pThis = pForm; *pThis; pThis++ )
    {
        if ( *pThis == '~' )
            continue;
        if ( *pThis == '(' )
            Counter++;
        else if ( *pThis == ')' )
            Counter--;
        if ( Counter == 0 )
            return pThis + 1;
    }
    assert( 0 );
    return NULL;
}